

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSShape * js_new_shape2(JSContext *ctx,JSObject *proto,int hash_size,int prop_size)

{
  int iVar1;
  int iVar2;
  JSRuntime *pJVar3;
  JSShape *pJVar4;
  list_head *plVar5;
  JSShape **ppJVar6;
  undefined8 *puVar7;
  JSShape *pJVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  JSRefCountHeader *p;
  size_t __n;
  
  pJVar3 = ctx->rt;
  if (pJVar3->shape_hash_size < pJVar3->shape_hash_count * 2 + 2) {
    iVar1 = pJVar3->shape_hash_bits;
    iVar9 = iVar1 + 1;
    iVar11 = 1 << ((byte)iVar9 & 0x1f);
    __n = (long)iVar11 << 3;
    ppJVar6 = (JSShape **)(*(pJVar3->mf).js_malloc)(&pJVar3->malloc_state,__n);
    if (ppJVar6 != (JSShape **)0x0) {
      memset(ppJVar6,0,__n);
      iVar2 = pJVar3->shape_hash_size;
      if (0 < (long)iVar2) {
        lVar10 = 0;
        do {
          pJVar8 = pJVar3->shape_hash[lVar10];
          while (pJVar8 != (JSShape *)0x0) {
            pJVar4 = pJVar8->shape_hash_next;
            uVar12 = pJVar8->hash >> (0x1fU - (char)iVar1 & 0x1f);
            pJVar8->shape_hash_next = ppJVar6[uVar12];
            ppJVar6[uVar12] = pJVar8;
            pJVar8 = pJVar4;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar2);
      }
      (*(pJVar3->mf).js_free)(&pJVar3->malloc_state,pJVar3->shape_hash);
      pJVar3->shape_hash_bits = iVar9;
      pJVar3->shape_hash_size = iVar11;
      pJVar3->shape_hash = ppJVar6;
    }
  }
  puVar7 = (undefined8 *)js_malloc(ctx,(ulong)(uint)hash_size * 8 + 0x50);
  if (puVar7 == (undefined8 *)0x0) {
    pJVar8 = (JSShape *)0x0;
  }
  else {
    pJVar8 = (JSShape *)(puVar7 + 2);
    *(undefined4 *)(puVar7 + 2) = 1;
    *(undefined1 *)((long)puVar7 + 0x14) = 2;
    plVar5 = (pJVar3->gc_obj_list).prev;
    plVar5->next = (list_head *)(puVar7 + 3);
    puVar7[3] = plVar5;
    puVar7[4] = &pJVar3->gc_obj_list;
    (pJVar3->gc_obj_list).prev = (list_head *)(puVar7 + 3);
    if (proto != (JSObject *)0x0) {
      (proto->field_0).header.ref_count = (proto->field_0).header.ref_count + 1;
    }
    puVar7[9] = proto;
    *puVar7 = 0;
    puVar7[1] = 0;
    *(undefined4 *)(puVar7 + 6) = 3;
    *(int *)((long)puVar7 + 0x34) = hash_size;
    puVar7[7] = 0;
    uVar12 = ((int)((ulong)proto >> 0x20) + (int)proto * -0x61c8ffff) * -0x61c8ffff + 0x3c6e0001;
    *(uint *)((long)puVar7 + 0x2c) = uVar12;
    *(undefined2 *)(puVar7 + 5) = 1;
    pJVar3 = ctx->rt;
    uVar12 = uVar12 >> (-(char)pJVar3->shape_hash_bits & 0x1fU);
    ppJVar6 = pJVar3->shape_hash;
    puVar7[8] = ppJVar6[uVar12];
    ppJVar6[uVar12] = pJVar8;
    pJVar3->shape_hash_count = pJVar3->shape_hash_count + 1;
  }
  return pJVar8;
}

Assistant:

static no_inline JSShape *js_new_shape2(JSContext *ctx, JSObject *proto,
                                        int hash_size, int prop_size)
{
    JSRuntime *rt = ctx->rt;
    void *sh_alloc;
    JSShape *sh;

    /* resize the shape hash table if necessary */
    if (2 * (rt->shape_hash_count + 1) > rt->shape_hash_size) {
        resize_shape_hash(rt, rt->shape_hash_bits + 1);
    }

    sh_alloc = js_malloc(ctx, get_shape_size(hash_size, prop_size));
    if (!sh_alloc)
        return NULL;
    sh = get_shape_from_alloc(sh_alloc, hash_size);
    sh->header.ref_count = 1;
    add_gc_object(rt, &sh->header, JS_GC_OBJ_TYPE_SHAPE);
    if (proto)
        JS_DupValue(ctx, JS_MKPTR(JS_TAG_OBJECT, proto));
    sh->proto = proto;
    memset(prop_hash_end(sh) - hash_size, 0, sizeof(prop_hash_end(sh)[0]) *
           hash_size);
    sh->prop_hash_mask = hash_size - 1;
    sh->prop_size = prop_size;
    sh->prop_count = 0;
    sh->deleted_prop_count = 0;
    
    /* insert in the hash table */
    sh->hash = shape_initial_hash(proto);
    sh->is_hashed = TRUE;
    sh->has_small_array_index = FALSE;
    js_shape_hash_link(ctx->rt, sh);
    return sh;
}